

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O1

void mserialize::detail::visit_impl<(anonymous_namespace)::StoreT<unsigned_short>,InputStream>
               (string_view full_tag,string_view tag,StoreT<unsigned_short> *visitor,
               InputStream *istream,int max_recursion)

{
  byte __rhs;
  code *pcVar1;
  double dVar2;
  int iVar3;
  StoreT<unsigned_short> *pSVar4;
  int iVar5;
  char extraout_AL;
  bool bVar6;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  char extraout_AL_05;
  char extraout_AL_06;
  char extraout_AL_07;
  char extraout_AL_08;
  char extraout_AL_09;
  char extraout_AL_10;
  char extraout_AL_11;
  char extraout_AL_12;
  char extraout_AL_13;
  char extraout_AL_14;
  char extraout_AL_15;
  char extraout_AL_16;
  char extraout_AL_17;
  char extraout_AL_18;
  char extraout_AL_19;
  char extraout_AL_20;
  char extraout_AL_21;
  char extraout_AL_22;
  char extraout_AL_23;
  char extraout_AL_24;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  long *plVar11;
  runtime_error *prVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_04;
  size_t extraout_RDX_05;
  char *pcVar14;
  char cVar15;
  detail *pdVar16;
  ulong uVar17;
  long lVar18;
  detail *pdVar19;
  detail *in_R10;
  ulong uVar20;
  int iVar21;
  detail *pdVar22;
  byte *pbVar23;
  ulong uVar24;
  char *pcVar25;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Da_22;
  undefined4 extraout_XMM0_Da_23;
  undefined4 extraout_XMM0_Da_24;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Db_22;
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Db_24;
  string_view full_tag_00;
  string_view full_tag_01;
  string_view full_tag_02;
  string_view full_tag_03;
  string_view full_tag_04;
  string_view full_tag_05;
  string_view tag_00;
  string_view tag_01;
  string_view tag_02;
  string_view tag_03;
  string_view tag_04;
  string_view tag_05;
  string_view tags;
  string_view tags_00;
  string_view tags_01;
  string_view tags_02;
  string_view tags_03;
  string_view tags_04;
  MessageBuilder _DOCTEST_MESSAGE_3;
  uint8_t discriminator;
  uint16_t S;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  ostream *local_b0;
  int local_a4;
  StoreT<unsigned_short> *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ulong local_70;
  detail *local_68;
  unsigned_short local_5a;
  InputStream *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  size_t extraout_RDX_03;
  
  uVar8 = tag._len;
  pbVar23 = (byte *)tag._ptr;
  local_70 = full_tag._len;
  full_tag_00._ptr = (detail *)full_tag._ptr;
  if (max_recursion == 0) {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,full_tag_00._ptr,full_tag_00._ptr + local_70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   "Recursion limit exceeded while visiting tag: ",&local_98);
    std::runtime_error::runtime_error(prVar12,(string *)local_d8);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (uVar8 == 0) {
    return;
  }
  __rhs = *pbVar23;
  pdVar22 = (detail *)(ulong)__rhs;
  if (__rhs < 0x3c) {
    if (__rhs == 0x28) {
      pcVar14 = (char *)0x0;
      if (uVar8 != 1) {
        pcVar14 = (char *)(uVar8 - 2);
      }
      local_a0 = visitor;
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x2b,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
      if (extraout_AL_05 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      pdVar22 = (detail *)(pbVar23 + 1);
      doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d8);
      tags_02._len = extraout_RDX_02;
      tags_02._ptr = pcVar14;
      pcVar10 = (char *)tag_first_size(pdVar22,tags_02);
      uVar8 = local_70;
      pSVar4 = local_a0;
      local_a4 = max_recursion;
      if (pcVar10 != (char *)0x0) {
        local_a4 = max_recursion + -1;
        pcVar25 = pcVar10;
        if (pcVar14 < pcVar10) {
          pcVar25 = pcVar14;
        }
        pcVar14 = pcVar14 + -(long)pcVar25;
        pdVar16 = (detail *)(pcVar25 + (long)pdVar22);
        do {
          pdVar19 = pdVar16;
          full_tag_03._len = uVar8;
          full_tag_03._ptr = (char *)full_tag_00._ptr;
          tag_03._len = (size_t)pcVar10;
          tag_03._ptr = (char *)pdVar22;
          visit_impl<(anonymous_namespace)::StoreT<unsigned_short>,InputStream>
                    (full_tag_03,tag_03,pSVar4,istream,local_a4);
          tags_03._len = extraout_RDX_03;
          tags_03._ptr = pcVar14;
          pcVar10 = (char *)tag_first_size(pdVar19,tags_03);
          pcVar25 = pcVar10;
          if (pcVar14 < pcVar10) {
            pcVar25 = pcVar14;
          }
          pcVar14 = pcVar14 + -(long)pcVar25;
          pdVar16 = pdVar19 + (long)pcVar25;
          pdVar22 = pdVar19;
        } while (pcVar10 != (char *)0x0);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
      if (extraout_AL_06 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      goto LAB_00151aad;
    }
    if (__rhs == 0x2f) {
      pbVar23 = pbVar23 + 1;
      if (uVar8 < 3) {
        lVar18 = 0;
        if (uVar8 != 1) {
          lVar18 = uVar8 - 2;
        }
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,pbVar23,pbVar23 + lVar18);
        std::operator+(&local_98,"Invalid enum tag: \'",&local_50);
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_d8._0_8_ = *plVar11;
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._0_8_ == paVar13) {
          local_c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_c8._8_8_ = plVar11[3];
          local_d8._0_8_ = &local_c8;
        }
        else {
          local_c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
        }
        local_d8._8_8_ = plVar11[1];
        *plVar11 = (long)paVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::runtime_error::runtime_error(prVar12,(string *)local_d8);
        __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_98.field_2._8_8_ = local_98.field_2._M_local_buf + 3;
      visit_arithmetic<mserialize::detail::IntegerToHex,InputStream>
                (*pbVar23,(IntegerToHex *)&local_98,istream);
      *(char *)(local_98.field_2._8_8_ + -1) = '\'';
      local_98.field_2._M_local_buf[3] = '`';
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
      if (extraout_AL_02 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      goto LAB_00151aad;
    }
  }
  else {
    if (__rhs == 0x3c) {
      pdVar22 = (detail *)(pbVar23 + 1);
      pcVar14 = (char *)0x0;
      if (uVar8 != 1) {
        pcVar14 = (char *)(uVar8 - 2);
      }
      local_a0 = visitor;
      local_68 = full_tag_00._ptr;
      std::istream::read((char *)istream->stream,(long)&local_98);
      sVar7 = extraout_RDX_00;
      for (cVar15 = (char)local_98._M_dataplus._M_p; cVar15 != '\0'; cVar15 = cVar15 + -1) {
        tags_00._len = sVar7;
        tags_00._ptr = pcVar14;
        pcVar10 = (char *)tag_first_size(pdVar22,tags_00);
        if (pcVar14 < pcVar10) {
          pcVar10 = pcVar14;
        }
        pdVar22 = pdVar22 + (long)pcVar10;
        pcVar14 = pcVar14 + -(long)pcVar10;
        sVar7 = extraout_RDX_01;
      }
      tags_01._len = sVar7;
      tags_01._ptr = pcVar14;
      sVar7 = tag_first_size(pdVar22,tags_01);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x2b,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      uVar8 = local_70;
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
      if (extraout_AL_03 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d8);
      if ((sVar7 == 1) && (iVar21 = bcmp(pdVar22,"0",1), iVar21 == 0)) {
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d8,
                           (double)CONCAT44(extraout_XMM0_Db_13,extraout_XMM0_Da_13));
        if (extraout_AL_13 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
        doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d8);
      }
      else {
        full_tag_02._len = uVar8;
        full_tag_02._ptr = (char *)local_68;
        tag_02._len = sVar7;
        tag_02._ptr = (char *)pdVar22;
        visit_impl<(anonymous_namespace)::StoreT<unsigned_short>,InputStream>
                  (full_tag_02,tag_02,local_a0,istream,max_recursion + -1);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
      if (extraout_AL_04 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      goto LAB_00151aad;
    }
    if (__rhs == 0x7b) {
      uVar24 = uVar8 - 1;
      if (uVar8 == 0) {
        uVar24 = 0;
      }
      uVar9 = 0;
      if (uVar8 - 1 != 0) {
        uVar8 = 0;
        do {
          uVar9 = uVar8;
          if (pbVar23[uVar8] == 0x60) break;
          uVar8 = uVar8 + 1;
          uVar9 = uVar24;
        } while (uVar24 != uVar8);
      }
      uVar8 = uVar9;
      if (uVar24 < uVar9) {
        uVar8 = uVar24;
      }
      uVar24 = uVar24 - uVar8;
      if (uVar24 == 0) {
        uVar8 = local_70;
        pdVar16 = full_tag_00._ptr;
        if (uVar9 != 0) {
          do {
            if (uVar8 == 0) goto LAB_001518db;
            uVar17 = uVar8;
            pdVar19 = pdVar16;
            do {
              uVar20 = 0;
              do {
                if (uVar17 == uVar20) {
                  bVar6 = false;
                  in_R10 = pdVar16 + uVar8;
                  goto LAB_00151838;
                }
                if (pdVar19[uVar20] != *(detail *)(pbVar23 + uVar20)) {
                  bVar6 = true;
                  goto LAB_00151838;
                }
                uVar20 = uVar20 + 1;
              } while (uVar9 != uVar20);
              bVar6 = false;
              in_R10 = pdVar19;
LAB_00151838:
              pdVar19 = pdVar19 + 1;
              uVar17 = uVar17 - 1;
            } while (bVar6);
            uVar17 = (long)in_R10 - (long)pdVar16;
            if (in_R10 == pdVar16 + uVar8) {
              uVar17 = 0xffffffffffffffff;
            }
            if (uVar8 < uVar17) {
              uVar17 = uVar8;
            }
            uVar8 = uVar8 - uVar17;
            uVar20 = uVar9;
            if (uVar8 < uVar9) {
              uVar20 = uVar8;
            }
            pdVar16 = pdVar16 + uVar20 + uVar17;
            iVar21 = 3;
            uVar8 = uVar8 - uVar20;
            if ((uVar8 != 0) && (*pdVar16 != (detail)0x7d)) {
              if (*pdVar16 == (detail)0x60) {
                iVar21 = 1;
                pdVar22 = pdVar16;
                if (uVar8 == 1) {
                  uVar24 = 0;
                }
                else {
                  uVar24 = 1;
                  lVar18 = 1;
                  do {
                    if (pdVar16[uVar24] == (detail)0x7d) {
                      lVar18 = lVar18 + -1;
                      if (lVar18 == 0) goto LAB_001518ce;
                    }
                    else if (pdVar16[uVar24] == (detail)0x7b) {
                      lVar18 = lVar18 + 1;
                    }
                    uVar24 = uVar24 + 1;
                  } while (uVar8 != uVar24);
                  uVar24 = uVar8 - 1;
                }
              }
              else {
                iVar21 = 0;
              }
            }
LAB_001518ce:
          } while (iVar21 == 0);
          if (iVar21 == 1) goto LAB_001518e0;
        }
LAB_001518db:
        pdVar22 = (detail *)0x0;
        uVar24 = 0;
      }
      else {
        pdVar22 = (detail *)(pbVar23 + uVar8);
      }
LAB_001518e0:
      local_a0 = visitor;
      local_68 = full_tag_00._ptr;
      local_58 = istream;
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x2b,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09));
      if (extraout_AL_09 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d8);
      if (uVar24 != 0) {
        sVar7 = extraout_RDX_04;
        do {
          uVar24 = uVar24 - 1;
          if (uVar24 == 0) {
            uVar8 = 1;
          }
          else {
            uVar9 = 0;
            do {
              uVar8 = uVar9;
              if (pdVar22[uVar9 + 1] == (detail)0x27) break;
              uVar9 = uVar9 + 1;
              uVar8 = uVar24;
            } while (uVar24 != uVar9);
            uVar8 = uVar8 + 1;
          }
          if (uVar24 < uVar8) {
            uVar8 = uVar24;
          }
          pdVar22 = pdVar22 + uVar8 + 1;
          pcVar25 = (char *)(uVar24 - uVar8);
          tags_04._len = sVar7;
          tags_04._ptr = pcVar25;
          pcVar10 = (char *)tag_first_size(pdVar22,tags_04);
          pcVar14 = pcVar10;
          if (pcVar25 < pcVar10) {
            pcVar14 = pcVar25;
          }
          doctest::detail::MessageBuilder::MessageBuilder
                    ((MessageBuilder *)local_d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                     ,0x28,is_require);
          std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
          dVar2 = doctest::detail::MessageBuilder::log
                            ((MessageBuilder *)local_d8,
                             (double)CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10));
          if (extraout_AL_10 != '\0') {
            pcVar1 = (code *)swi(3);
            (*pcVar1)(SUB84(dVar2,0));
            return;
          }
          doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
          doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d8);
          full_tag_05._len = local_70;
          full_tag_05._ptr = (char *)local_68;
          tag_05._len = (size_t)pcVar10;
          tag_05._ptr = (char *)pdVar22;
          visit_impl<(anonymous_namespace)::StoreT<unsigned_short>,InputStream>
                    (full_tag_05,tag_05,local_a0,local_58,max_recursion + -1);
          doctest::detail::MessageBuilder::MessageBuilder
                    ((MessageBuilder *)local_d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                     ,0x28,is_require);
          std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
          dVar2 = doctest::detail::MessageBuilder::log
                            ((MessageBuilder *)local_d8,
                             (double)CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11));
          if (extraout_AL_11 != '\0') {
            pcVar1 = (code *)swi(3);
            (*pcVar1)(SUB84(dVar2,0));
            return;
          }
          doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
          pdVar22 = pdVar22 + (long)pcVar14;
          uVar24 = (long)pcVar25 - (long)pcVar14;
          doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d8);
          sVar7 = extraout_RDX_05;
        } while (uVar24 != 0);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_12,extraout_XMM0_Da_12));
      if (extraout_AL_12 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      goto LAB_00151aad;
    }
    if (__rhs == 0x5b) {
      pdVar22 = (detail *)(pbVar23 + 1);
      local_a0 = visitor;
      std::istream::read((char *)istream->stream,(long)&local_98);
      tags._len = extraout_RDX;
      tags._ptr = (char *)(uVar8 - 1);
      sVar7 = tag_first_size(pdVar22,tags);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x2b,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      uVar8 = local_70;
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      if (extraout_AL != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      iVar21 = max_recursion + -1;
      doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d8);
      if (((uint)local_98._M_dataplus._M_p < 0x21) ||
         (full_tag_00._len = uVar8, tag_00._len = sVar7, tag_00._ptr = (char *)pdVar22,
         bVar6 = singular_impl(full_tag_00,tag_00,iVar21), !bVar6)) {
        pSVar4 = local_a0;
        iVar3 = (uint)local_98._M_dataplus._M_p;
        local_98._M_dataplus._M_p._0_4_ = (uint)local_98._M_dataplus._M_p + -1;
        iVar5 = local_a4;
        while (local_a4 = iVar21, iVar3 != 0) {
          full_tag_04._len = uVar8;
          full_tag_04._ptr = (char *)full_tag_00._ptr;
          tag_04._len = sVar7;
          tag_04._ptr = (char *)pdVar22;
          visit_impl<(anonymous_namespace)::StoreT<unsigned_short>,InputStream>
                    (full_tag_04,tag_04,pSVar4,istream,local_a4);
          iVar3 = (uint)local_98._M_dataplus._M_p;
          local_98._M_dataplus._M_p._0_4_ = (uint)local_98._M_dataplus._M_p + -1;
          iVar21 = local_a4;
          iVar5 = local_a4;
        }
      }
      else {
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        uVar8 = local_70;
        std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d8,
                           (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        if (extraout_AL_00 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
        doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d8);
        full_tag_01._len = uVar8;
        full_tag_01._ptr = (char *)full_tag_00._ptr;
        tag_01._len = sVar7;
        tag_01._ptr = (char *)pdVar22;
        visit_impl<(anonymous_namespace)::StoreT<unsigned_short>,InputStream>
                  (full_tag_01,tag_01,local_a0,istream,iVar21);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d8,
                           (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
        if (extraout_AL_01 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
        doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d8);
        iVar5 = local_a4;
      }
      local_a4 = iVar5;
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
      if (extraout_AL_08 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      goto LAB_00151aad;
    }
  }
  if (__rhs < 0x62) {
    if (__rhs < 0x49) {
      if (__rhs == 0x42) {
        std::istream::read((char *)istream->stream,(long)&local_98);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d8,
                           (double)CONCAT44(extraout_XMM0_Db_23,extraout_XMM0_Da_23));
        if (extraout_AL_23 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      }
      else {
        if (__rhs != 0x44) goto switchD_00151623_caseD_65;
        std::istream::read((char *)istream->stream,(long)&local_98);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d8,
                           (double)CONCAT44(extraout_XMM0_Db_15,extraout_XMM0_Da_15));
        if (extraout_AL_15 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      }
    }
    else if (__rhs == 0x49) {
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_22,extraout_XMM0_Da_22));
      if (extraout_AL_22 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
    }
    else {
      if (__rhs != 0x4c) {
        if (__rhs == 0x53) {
          std::istream::read((char *)istream->stream,(long)&local_5a);
          doctest::detail::ExpressionDecomposer::ExpressionDecomposer
                    ((ExpressionDecomposer *)&local_50,DT_CHECK);
          local_98._M_dataplus._M_p =
               (pointer)((long)local_50._M_dataplus._M_p << 0x20 | (ulong)visitor->_has_visit ^ 1);
          doctest::detail::Expression_lhs::operator_cast_to_Result
                    ((Result *)local_d8,(Expression_lhs *)&local_98);
          doctest::detail::decomp_assert
                    ((detail *)0xa,0x1b93e8,(char *)0x22,0x1babc4,(char *)local_d8,(Result *)istream
                    );
          doctest::String::~String((String *)(local_d8 + 8));
          visitor->_has_visit = true;
          visitor->_value = local_5a;
          return;
        }
        goto switchD_00151623_caseD_65;
      }
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_21,extraout_XMM0_Da_21));
      if (extraout_AL_21 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
    }
  }
  else {
    switch(__rhs) {
    case 0x62:
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
      if (extraout_AL_07 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      break;
    case 99:
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_17,extraout_XMM0_Da_17));
      if (extraout_AL_17 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      break;
    case 100:
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_16,extraout_XMM0_Da_16));
      if (extraout_AL_16 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      break;
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
switchD_00151623_caseD_65:
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Invalid arithmetic tag: ","");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                     &local_98,__rhs);
      std::runtime_error::runtime_error(prVar12,(string *)local_d8);
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    case 0x66:
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_19,extraout_XMM0_Da_19));
      if (extraout_AL_19 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      break;
    case 0x69:
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_20,extraout_XMM0_Da_20));
      if (extraout_AL_20 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      break;
    case 0x6c:
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_18,extraout_XMM0_Da_18));
      if (extraout_AL_18 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      break;
    default:
      if (__rhs == 0x73) {
        std::istream::read((char *)istream->stream,(long)&local_98);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d8,
                           (double)CONCAT44(extraout_XMM0_Db_24,extraout_XMM0_Da_24));
        if (extraout_AL_24 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      }
      else {
        if (__rhs != 0x79) goto switchD_00151623_caseD_65;
        std::istream::read((char *)istream->stream,(long)&local_98);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d8,
                           (double)CONCAT44(extraout_XMM0_Db_14,extraout_XMM0_Da_14));
        if (extraout_AL_14 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      }
    }
  }
LAB_00151aad:
  doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d8);
  return;
}

Assistant:

void visit_impl(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  if (max_recursion == 0) { throw std::runtime_error("Recursion limit exceeded while visiting tag: " + full_tag.to_string()); }

  if (tag.empty()) { return; }

  switch (tag.front())
  {
  case '[':
    visit_sequence(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '(':
    visit_tuple(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '<':
    visit_variant(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '{':
    visit_struct(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '/':
    visit_enum(tag, visitor, istream);
    break;
  default:
    visit_arithmetic(tag.front(), visitor, istream);
  }
}